

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

int __thiscall miniros::NodeHandle::shutdown(NodeHandle *this,int __fd,int __how)

{
  pointer pwVar1;
  pointer pwVar2;
  pointer pwVar3;
  pointer pwVar4;
  NodeHandleBackingCollection *pNVar5;
  NodeHandleBackingCollection *extraout_RAX;
  int __how_00;
  pointer pwVar6;
  pointer pwVar7;
  pointer pwVar8;
  pointer pwVar9;
  pointer pwVar10;
  ImplPtr impl;
  __shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  pwVar1 = (this->collection_->subs_).
           super__Vector_base<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar7 = (this->collection_->subs_).
                super__Vector_base<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pwVar7 != pwVar1; pwVar7 = pwVar7 + 1) {
    std::__shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2> *)&local_38,
               pwVar7);
    if (local_38._M_ptr != (Impl *)0x0) {
      Subscriber::Impl::unsubscribe((Impl *)local_38._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  pwVar2 = (this->collection_->pubs_).
           super__Vector_base<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar8 = (this->collection_->pubs_).
                super__Vector_base<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pwVar8 != pwVar2; pwVar8 = pwVar8 + 1) {
    std::__shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2> *)&local_38,
               pwVar8);
    if (local_38._M_ptr != (Impl *)0x0) {
      Publisher::Impl::unadvertise((Impl *)local_38._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  pwVar3 = (this->collection_->srvs_).
           super__Vector_base<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar9 = (this->collection_->srvs_).
                super__Vector_base<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pwVar9 != pwVar3; pwVar9 = pwVar9 + 1) {
    std::__shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2> *)&local_38,
               pwVar9);
    if (local_38._M_ptr != (Impl *)0x0) {
      ServiceServer::Impl::unadvertise((Impl *)local_38._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  pNVar5 = this->collection_;
  pwVar4 = (pNVar5->srv_cs_).
           super__Vector_base<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar10 = (pNVar5->srv_cs_).
                 super__Vector_base<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pwVar10 != pwVar4; pwVar10 = pwVar10 + 1
      ) {
    pwVar6 = pwVar10;
    std::__shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38);
    if (local_38._M_ptr != (Impl *)0x0) {
      ServiceClient::Impl::shutdown(local_38._M_ptr,(int)pwVar6,__how_00);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    pNVar5 = extraout_RAX;
  }
  this->ok_ = false;
  return (int)pNVar5;
}

Assistant:

void NodeHandle::shutdown()
{
  {
    NodeHandleBackingCollection::V_SubImpl::iterator it = collection_->subs_.begin();
    NodeHandleBackingCollection::V_SubImpl::iterator end = collection_->subs_.end();
    for (; it != end; ++it)
    {
      Subscriber::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unsubscribe();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_PubImpl::iterator it = collection_->pubs_.begin();
    NodeHandleBackingCollection::V_PubImpl::iterator end = collection_->pubs_.end();
    for (; it != end; ++it)
    {
      Publisher::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvImpl::iterator it = collection_->srvs_.begin();
    NodeHandleBackingCollection::V_SrvImpl::iterator end = collection_->srvs_.end();
    for (; it != end; ++it)
    {
      ServiceServer::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvCImpl::iterator it = collection_->srv_cs_.begin();
    NodeHandleBackingCollection::V_SrvCImpl::iterator end = collection_->srv_cs_.end();
    for (; it != end; ++it)
    {
      ServiceClient::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->shutdown();
      }
    }
  }

  ok_ = false;
}